

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.h
# Opt level: O2

div_t __thiscall cali::Variant::div(Variant *this,int __numer,int __denom)

{
  char cVar1;
  div_t dVar2;
  div_t dStack_8;
  
  cVar1 = (char)(this->m_v).type_and_size;
  if (cVar1 == '\x02') {
    dStack_8.quot = 2;
    dStack_8.rem = 0;
  }
  else if (cVar1 == '\x03') {
    dStack_8.quot = 3;
    dStack_8.rem = 0;
  }
  else {
    if (cVar1 != '\x06') {
      dVar2.quot = 0;
      dVar2.rem = 0;
      return dVar2;
    }
    dStack_8.quot = 6;
    dStack_8.rem = 0;
  }
  return dStack_8;
}

Assistant:

cali_attr_type type() const { return cali_variant_get_type(m_v); }